

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_perform_subscription_callback(void *s_,void *msg_)

{
  char cVar1;
  fio_defer_task_s task;
  fio_lock_i ret_1;
  fio_lock_i ret;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_78 [2];
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined1 local_30;
  long local_28;
  undefined8 local_20;
  long local_18;
  
  LOCK();
  cVar1 = *(char *)((long)s_ + 0x40);
  *(char *)((long)s_ + 0x40) = '\x01';
  UNLOCK();
  local_78[0] = CONCAT31(local_78[0]._1_3_,cVar1);
  uStack_88 = SUB84(s_,0);
  uStack_84 = (undefined4)((ulong)s_ >> 0x20);
  if (cVar1 == '\0') {
    local_78[0] = *(undefined4 *)((long)msg_ + 0x38);
    local_60 = *(undefined8 *)((long)msg_ + 0x10);
    local_70 = *msg_;
    uStack_68 = *(undefined8 *)((long)msg_ + 8);
    local_58 = *(undefined8 *)((long)msg_ + 0x18);
    uStack_50 = *(undefined8 *)((long)msg_ + 0x20);
    local_48 = *(undefined8 *)((long)msg_ + 0x28);
    local_40 = *(undefined4 *)((long)s_ + 0x28);
    uStack_3c = *(undefined4 *)((long)s_ + 0x2c);
    uStack_38 = *(undefined4 *)((long)s_ + 0x30);
    uStack_34 = *(undefined4 *)((long)s_ + 0x34);
    local_30 = 0;
    local_28 = 0;
    local_20 = *(undefined8 *)((long)msg_ + 0x40);
    local_18 = (long)msg_ + 0x48;
    if (*(code **)((long)s_ + 0x18) != (code *)0x0) {
      (**(code **)((long)s_ + 0x18))(local_78);
    }
    LOCK();
    *(undefined1 *)((long)s_ + 0x40) = 0;
    UNLOCK();
    if (local_28 == 0) {
      fio_msg_internal_free((fio_msg_internal_s *)msg_);
      fio_subscription_free((subscription_s *)s_);
      return;
    }
  }
  task.arg1._0_4_ = uStack_88;
  task.func = fio_perform_subscription_callback;
  task.arg1._4_4_ = uStack_84;
  task.arg2 = msg_;
  fio_defer_push_task_fn(task,&task_queue_normal);
  return;
}

Assistant:

static void fio_perform_subscription_callback(void *s_, void *msg_) {
  subscription_s *s = s_;
  if (fio_trylock(&s->lock)) {
    fio_defer_push_task(fio_perform_subscription_callback, s_, msg_);
    return;
  }
  fio_msg_internal_s *msg = (fio_msg_internal_s *)msg_;
  fio_msg_client_s m = {
      .msg =
          {
              .channel = msg->channel,
              .msg = msg->data,
              .filter = msg->filter,
              .udata1 = s->udata1,
              .udata2 = s->udata2,
          },
      .meta_len = msg->meta_len,
      .meta = msg->meta,
      .marker = 0,
  };
  if (s->on_message) {
    /* the on_message callback is removed when a subscription is canceled. */
    s->on_message(&m.msg);
  }
  fio_unlock(&s->lock);
  if (m.marker) {
    fio_defer_push_task(fio_perform_subscription_callback, s_, msg_);
    return;
  }
  fio_msg_internal_free(msg);
  fio_subscription_free(s);
}